

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_string_utf8_ref(sexp ctx,sexp str,sexp i)

{
  undefined1 auVar1 [16];
  byte *pbVar2;
  ulong in_RDX;
  long in_RSI;
  uchar *p;
  sexp in_stack_00000038;
  char *in_stack_00000040;
  sexp in_stack_00000048;
  sexp in_stack_00000050;
  sexp local_8;
  
  auVar1._8_8_ = (long)in_RDX >> 0x3f;
  auVar1._0_8_ = in_RDX & 0xfffffffffffffffd;
  pbVar2 = (byte *)(*(long *)(in_RSI + 8) + 0x10 + *(long *)(in_RSI + 0x10) +
                   SUB168(auVar1 / SEXT816(8),0));
  if (*pbVar2 < 0x80) {
    local_8 = (sexp)((ulong)*pbVar2 * 0x100 + 0x1e);
  }
  else if ((*pbVar2 < 0xc0) || (0xf7 < *pbVar2)) {
    local_8 = sexp_user_exception(in_stack_00000050,in_stack_00000048,in_stack_00000040,
                                  in_stack_00000038);
  }
  else if (*pbVar2 < 0xe0) {
    local_8 = (sexp)((long)(int)((*pbVar2 & 0x3f) * 0x40 + (pbVar2[1] & 0x3f)) * 0x100 + 0x1e);
  }
  else if (*pbVar2 < 0xf0) {
    local_8 = (sexp)((long)(int)((*pbVar2 & 0x1f) * 0x1000 + (pbVar2[1] & 0x3f) * 0x40 +
                                (pbVar2[2] & 0x3f)) * 0x100 + 0x1e);
  }
  else {
    local_8 = (sexp)((long)(int)((*pbVar2 & 0xf) * 0x40000 + (pbVar2[1] & 0x3f) * 0x1000 +
                                 (pbVar2[2] & 0x3f) * 0x40 + (pbVar2[3] & 0x3f)) * 0x100 + 0x1e);
  }
  return local_8;
}

Assistant:

sexp sexp_string_utf8_ref (sexp ctx, sexp str, sexp i) {
  unsigned char *p=(unsigned char*)sexp_string_data(str) + sexp_unbox_string_cursor(i);
  if (*p < 0x80)
    return sexp_make_character(*p);
  else if ((*p < 0xC0) || (*p > 0xF7))
    return sexp_user_exception(ctx, NULL, "string-ref: invalid utf8 byte", i);
  else if (*p < 0xE0)
    return sexp_make_character(((p[0]&0x3F)<<6) + (p[1]&0x3F));
  else if (*p < 0xF0)
    return sexp_make_character(((p[0]&0x1F)<<12) + ((p[1]&0x3F)<<6) + (p[2]&0x3F));
  else
    return sexp_make_character(((p[0]&0x0F)<<18) + ((p[1]&0x3F)<<12) + ((p[2]&0x3F)<<6) + (p[3]&0x3F));
}